

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLRefInfo.cpp
# Opt level: O1

XSerializable * xercesc_4_0::XMLRefInfo::createObject(MemoryManager *manager)

{
  XMLRefInfo *this;
  
  this = (XMLRefInfo *)XMemory::operator_new(0x20,manager);
  XMLRefInfo(this,manager);
  return &this->super_XSerializable;
}

Assistant:

void XMLRefInfo::serialize(XSerializeEngine& serEng)
{
    if (serEng.isStoring())
    {   
        serEng<<fDeclared;
        serEng<<fUsed;
        serEng.writeString(fRefName);
    }
    else
    {
        serEng>>fDeclared;
        serEng>>fUsed;
        serEng.readString(fRefName);
    }

}